

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

void __thiscall xmrig::Client::handshake(Client *this)

{
  ulong uVar1;
  uint64_t uVar2;
  long *in_RDI;
  Client *in_stack_00000130;
  Tls *in_stack_ffffffffffffffe8;
  
  uVar1 = (**(code **)(*in_RDI + 0x28))();
  if ((uVar1 & 1) == 0) {
    login(in_stack_00000130);
  }
  else {
    uVar2 = Chrono::steadyMSecs();
    in_RDI[0x957] = uVar2 + 20000;
    Tls::handshake(in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void xmrig::Client::handshake()
{
#   ifdef XMRIG_FEATURE_TLS
    if (isTLS()) {
        m_expire = Chrono::steadyMSecs() + kResponseTimeout;

        m_tls->handshake();
    }
    else
#   endif
    {
        login();
    }
}